

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O1

void test_framework(void)

{
  duk_context *ctx;
  
  ctx = duk_create_heap((duk_alloc_function)0x0,(duk_realloc_function)0x0,(duk_free_function)0x0,
                        (void *)0x0,(duk_fatal_function)0x0);
  test_eval(ctx,"var test = 2;");
  test_eval_expect(ctx,"test",2);
  test_eval(ctx,"var str = \'Butts\';");
  test_eval_expect(ctx,"str","Butts");
  test_eval_expect_error(ctx,"#($*)@*(");
  duk_destroy_heap(ctx);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Framework OK",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void test_framework() {
	duk_context* ctx = duk_create_heap_default();

	test_eval(ctx, "var test = 2;");
	test_eval_expect(ctx, "test", 2);
	test_eval(ctx, "var str = 'Butts';");
	test_eval_expect(ctx, "str", "Butts");
	test_eval_expect_error(ctx, "#($*)@*(");
	test_assert(true);

	duk_destroy_heap(ctx);

	std::cout << "Framework OK" << std::endl;
}